

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O3

int __thiscall
CubicLattice::neighbour(CubicLattice *this,int vertexIndex,string *direction,int sign)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  int iVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  uint uVar6;
  uint uVar7;
  cartesian4 cVar8;
  string errorMessage;
  string errorDir;
  cartesian4 errorCoord;
  ostringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  cartesian4 local_1e8;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  cartesian4 local_1b8;
  ostringstream local_1a8 [376];
  
  if ((sign != -1) && (sign != 1)) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Sign must be either 1 or -1.");
LAB_001311d8:
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar3 = std::__cxx11::string::compare((char *)direction);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)direction);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)direction);
      if (iVar3 != 0) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar5,"Direction must be one of \'x\', \'y\' or \'z\'.");
        goto LAB_001311d8;
      }
    }
  }
  cVar8 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  auVar2 = cVar8._0_12_;
  local_1e8 = cVar8;
  if (cVar8.w == 1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Cubic lattice doesn\'t contain w=0 vertices.");
    goto LAB_001311d8;
  }
  uVar7 = cVar8.y;
  iVar3 = std::__cxx11::string::compare((char *)direction);
  if (iVar3 == 0) {
    uVar6 = cVar8.x + sign;
    auVar1._4_4_ = 0;
    auVar1._0_4_ = uVar6;
    auVar1._8_8_ = cVar8._8_8_;
    auVar2 = auVar1._0_12_;
    local_1e8.x = uVar6;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)direction);
    if (iVar3 == 0) {
      uVar7 = uVar7 + sign;
      local_1e8.y = uVar7;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)direction);
      if (iVar3 == 0) {
        iVar3 = cVar8.z + sign;
        auVar2._8_4_ = iVar3;
        auVar2._0_8_ = cVar8._0_8_;
        local_1e8.z = iVar3;
      }
    }
  }
  if ((((-1 < auVar2._0_4_) && (uVar6 = (this->super_Lattice).l, auVar2._0_4_ < (int)uVar6)) &&
      (-1 < (int)uVar7)) &&
     (((uVar7 < uVar6 && (-1 < auVar2._8_4_)) && (auVar2._8_4_ < (int)uVar6)))) {
    iVar3 = Lattice::coordinateToIndex(&this->super_Lattice,&local_1e8);
    return iVar3;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1b8 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  local_1d8 = local_1c8;
  local_1d0 = 0;
  local_1c8[0] = '\0';
  if (sign == -1) {
    std::operator+(&local_208,"-",direction);
  }
  else {
    if (sign != 1) goto LAB_0013111b;
    std::operator+(&local_208,"+",direction);
  }
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
LAB_0013111b:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"CubicLattice::neighbour, ",0x19);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," neighbour of ",0xe);
  poVar4 = operator<<(poVar4,&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," is outside the lattice.",0x18);
  std::__cxx11::stringbuf::str();
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,(string *)&local_208);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int CubicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "x" || direction == "y" || direction == "z"))
    {
        throw std::invalid_argument("Direction must be one of 'x', 'y' or 'z'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        throw std::invalid_argument("Cubic lattice doesn't contain w=0 vertices.");
    }
    else
    {
        if (direction == "x")
        {
            coordinate.x = coordinate.x + sign;
        }
        else if (direction == "y")
        {
            coordinate.y = coordinate.y + sign;
        }
        else if (direction == "z")
        {
            coordinate.z = coordinate.z + sign;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "CubicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}